

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<siginfo_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:327:30)>
::getImpl(SimpleTransformPromiseNode<siginfo_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:327:30)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<siginfo_t> depResult;
  ExceptionOr<kj::_::Void> local_3d0;
  NullableValue<kj::Exception> local_230;
  char local_98;
  siginfo_t local_90;
  
  local_230.isSet = false;
  local_98 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_230);
  if (local_230.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_3d0,&local_230.field_1.value);
    local_3d0.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_3d0);
  }
  else {
    if (local_98 != '\x01') goto LAB_001c9326;
    anon_class_8_1_585a1678_for_func::operator()(&this->func,&local_90);
    local_3d0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3d0.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_3d0);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_3d0);
LAB_001c9326:
  NullableValue<kj::Exception>::~NullableValue(&local_230);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }